

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CivetServer.cpp
# Opt level: O3

int CivetServer::requestHandler(mg_connection *conn,void *cbdata)

{
  void *pvVar1;
  pointer pcVar2;
  char *__s1;
  byte bVar3;
  int iVar4;
  mg_request_info *pmVar5;
  mapped_type *pmVar6;
  long lVar7;
  uint uVar8;
  uint local_2c;
  mg_connection *local_28;
  
  local_28 = conn;
  pmVar5 = mg_get_request_info(conn);
  pvVar1 = pmVar5->user_data;
  local_2c = 0xffffffff;
  if (*(mg_context **)((long)pvVar1 + 8) == (mg_context *)0x0) {
    return 0;
  }
  mg_lock_context(*(mg_context **)((long)pvVar1 + 8));
  pmVar6 = std::
           map<const_mg_connection_*,_CivetServer::CivetConnection,_std::less<const_mg_connection_*>,_std::allocator<std::pair<const_mg_connection_*const,_CivetServer::CivetConnection>_>_>
           ::operator[]((map<const_mg_connection_*,_CivetServer::CivetConnection,_std::less<const_mg_connection_*>,_std::allocator<std::pair<const_mg_connection_*const,_CivetServer::CivetConnection>_>_>
                         *)((long)pvVar1 + 0x10),&local_28);
  pcVar2 = (pmVar6->postData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  (pmVar6->postData).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (pmVar6->postData).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (pmVar6->postData).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  if (pcVar2 != (pointer)0x0) {
    operator_delete(pcVar2);
  }
  mg_unlock_context(*(mg_context **)((long)pvVar1 + 8));
  uVar8 = 0;
  if (cbdata != (void *)0x0) {
    __s1 = pmVar5->request_method;
    iVar4 = strcmp(__s1,"GET");
    if (iVar4 == 0) {
      (**(code **)(*cbdata + 0x18))(cbdata,pvVar1,local_28,&local_2c);
      if (-1 < (int)local_2c) {
        return local_2c;
      }
      lVar7 = 0x10;
    }
    else {
      iVar4 = strcmp(__s1,"POST");
      if (iVar4 == 0) {
        (**(code **)(*cbdata + 0x28))(cbdata,pvVar1,local_28,&local_2c);
        if (-1 < (int)local_2c) {
          return local_2c;
        }
        lVar7 = 0x20;
      }
      else {
        iVar4 = strcmp(__s1,"HEAD");
        if (iVar4 == 0) {
          (**(code **)(*cbdata + 0x38))(cbdata,pvVar1,local_28,&local_2c);
          if (-1 < (int)local_2c) {
            return local_2c;
          }
          lVar7 = 0x30;
        }
        else {
          iVar4 = strcmp(__s1,"PUT");
          if (iVar4 == 0) {
            (**(code **)(*cbdata + 0x48))(cbdata,pvVar1,local_28,&local_2c);
            if (-1 < (int)local_2c) {
              return local_2c;
            }
            lVar7 = 0x40;
          }
          else {
            iVar4 = strcmp(__s1,"DELETE");
            if (iVar4 == 0) {
              (**(code **)(*cbdata + 0x58))(cbdata,pvVar1,local_28,&local_2c);
              if (-1 < (int)local_2c) {
                return local_2c;
              }
              lVar7 = 0x50;
            }
            else {
              iVar4 = strcmp(__s1,"OPTIONS");
              if (iVar4 == 0) {
                (**(code **)(*cbdata + 0x68))(cbdata,pvVar1,local_28,&local_2c);
                if (-1 < (int)local_2c) {
                  return local_2c;
                }
                lVar7 = 0x60;
              }
              else {
                iVar4 = strcmp(__s1,"PATCH");
                uVar8 = 0;
                if (iVar4 != 0) goto LAB_0010a3b9;
                (**(code **)(*cbdata + 0x78))(cbdata,pvVar1,local_28,&local_2c);
                if (-1 < (int)local_2c) {
                  return local_2c;
                }
                lVar7 = 0x70;
              }
            }
          }
        }
      }
    }
    bVar3 = (**(code **)(*cbdata + lVar7))(cbdata,pvVar1,local_28);
    uVar8 = (uint)bVar3;
  }
LAB_0010a3b9:
  if (-1 < (int)local_2c) {
    uVar8 = local_2c;
  }
  return uVar8;
}

Assistant:

int
CivetServer::requestHandler(struct mg_connection *conn, void *cbdata)
{
	const struct mg_request_info *request_info = mg_get_request_info(conn);
	assert(request_info != NULL);
	CivetServer *me = (CivetServer *)(request_info->user_data);
	assert(me != NULL);
	int http_status_code = -1;
	bool status_ok = false;

	// Happens when a request hits the server before the context is saved
	if (me->context == NULL)
		return 0;

	mg_lock_context(me->context);
	me->connections[conn] = CivetConnection();
	mg_unlock_context(me->context);

	CivetHandler *handler = (CivetHandler *)cbdata;

	if (handler) {
		if (strcmp(request_info->request_method, "GET") == 0) {
			status_ok = handler->handleGet(me, conn, &http_status_code);
			if (http_status_code < 0) {
				status_ok = handler->handleGet(me, conn);
			}
		} else if (strcmp(request_info->request_method, "POST") == 0) {
			status_ok = handler->handlePost(me, conn, &http_status_code);
			if (http_status_code < 0) {
				status_ok = handler->handlePost(me, conn);
			}
		} else if (strcmp(request_info->request_method, "HEAD") == 0) {
			status_ok = handler->handleHead(me, conn, &http_status_code);
			if (http_status_code < 0) {
				status_ok = handler->handleHead(me, conn);
			}
		} else if (strcmp(request_info->request_method, "PUT") == 0) {
			status_ok = handler->handlePut(me, conn, &http_status_code);
			if (http_status_code < 0) {
				status_ok = handler->handlePut(me, conn);
			}
		} else if (strcmp(request_info->request_method, "DELETE") == 0) {
			status_ok = handler->handleDelete(me, conn, &http_status_code);
			if (http_status_code < 0) {
				status_ok = handler->handleDelete(me, conn);
			}
		} else if (strcmp(request_info->request_method, "OPTIONS") == 0) {
			status_ok = handler->handleOptions(me, conn, &http_status_code);
			if (http_status_code < 0) {
				status_ok = handler->handleOptions(me, conn);
			}
		} else if (strcmp(request_info->request_method, "PATCH") == 0) {
			status_ok = handler->handlePatch(me, conn, &http_status_code);
			if (http_status_code < 0) {
				status_ok = handler->handlePatch(me, conn);
			}
		}
	}

	if (http_status_code < 0) {
		http_status_code = status_ok ? 1 : 0;
	}

	return http_status_code;
}